

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O1

void test_refined_peaks_out_hw(void)

{
  runtime_error *this;
  uint uVar1;
  float refined_peaks [2];
  int counts;
  int peaks [2];
  float cmap [16];
  
  counts = 1;
  peaks[0] = 1;
  peaks[1] = 2;
  cmap[0] = 0.0;
  cmap[1] = 0.0;
  cmap[4] = 0.0;
  cmap[8] = 0.0;
  cmap[9] = 0.0;
  cmap[0xc] = 0.0;
  cmap[0xd] = 0.0;
  cmap[0xe] = 0.0;
  cmap[0xf] = 0.0;
  cmap[2] = 1.0;
  cmap[3] = 0.0;
  cmap[5] = 2.0;
  cmap[6] = 3.0;
  cmap[7] = 1.0;
  cmap[10] = 2.0;
  cmap[0xb] = 0.0;
  trt_pose::parse::refine_peaks_out_hw(refined_peaks,&counts,peaks,cmap,4,4,1,3);
  uVar1 = -(uint)(0.0 < refined_peaks[0] + -0.4027778);
  if (1e-05 < (float)(~uVar1 & (uint)(-0.4027778 - refined_peaks[0]) |
                     (uint)(refined_peaks[0] + -0.4027778) & uVar1)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"i coordinate incorrect");
  }
  else {
    uVar1 = -(uint)(0.0 < refined_peaks[1] + -0.5972222);
    if ((float)(~uVar1 & (uint)(-0.5972222 - refined_peaks[1]) |
               (uint)(refined_peaks[1] + -0.5972222) & uVar1) <= 1e-05) {
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"j coordinate incorrect");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_refined_peaks_out_hw()
{
  const int H = 4;
  const int W = 4;
  const int M = 1;
  const int window_size = 3;

  const int counts = 1;
  const int peaks[M * 2] = { 1, 2 };
  const float cmap[H * W] = {

    0., 0., 1., 0.,
    0., 2., 3., 1.,
    0., 0., 2., 0.,
    0., 0., 0., 0.

  };
  const float i_true = (0.5 + (1. * 0 + 2. * 1 + 3. * 1 + 1. * 1 + 2. * 2) / 9.) / H;
  const float j_true = (0.5 + (2. * 1 + 1. * 2 + 3. * 2 + 2. * 2 + 1. * 3) / 9.) / W;
  const float tolerance = 1e-5;

  float refined_peaks[M * 2];

  refine_peaks_out_hw(refined_peaks, &counts, peaks, cmap, H, W, M, window_size);

  if (ABS(refined_peaks[0] - i_true) > tolerance) {
    throw std::runtime_error("i coordinate incorrect");
  }
  if (ABS(refined_peaks[1] - j_true) > tolerance) {
    throw std::runtime_error("j coordinate incorrect");
  }
}